

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::metrics::MetricsTest_testCounter_Test::~MetricsTest_testCounter_Test
          (MetricsTest_testCounter_Test *this)

{
  MetricsTest_testCounter_Test *this_local;
  
  ~MetricsTest_testCounter_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(MetricsTest, testCounter)
{
    constexpr auto counterValue = static_cast<int64_t>(3);
    constexpr auto metricName = "jaeger.test-counter";
    StatsFactoryImpl factory(_metricsReporter);
    auto counter = factory.createCounter(metricName);
    counter->inc(counterValue);
    const auto& counters = _metricsReporter.counters();
    ASSERT_EQ(1, counters.size());
    auto itr = counters.find(metricName);
    ASSERT_TRUE(itr != std::end(counters));
    ASSERT_EQ(counterValue, itr->second);
}